

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

void refreshSimpleDateTime(QDateTimeData *d)

{
  QDateTimePrivate *pQVar1;
  uint uVar2;
  uint uVar3;
  
  pQVar1 = d->d;
  if (((ulong)pQVar1 & 1) == 0) {
    uVar2 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    uVar2 = (uint)(byte)pQVar1;
  }
  uVar3 = (uVar2 & 0xfffffff7) + (uint)((~uVar2 & 6) == 0) * 8;
  if ((uVar2 & 1) == 0) {
    (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = uVar3;
    return;
  }
  d->d = (QDateTimePrivate *)((ulong)pQVar1 & 0xffffffffffffff00 | (ulong)(uVar3 & 0xff));
  return;
}

Assistant:

static void refreshSimpleDateTime(QDateTimeData &d)
{
    auto status = getStatus(d);
    Q_ASSERT(QTimeZone::isUtcOrFixedOffset(extractSpec(status)));
    status.setFlag(QDateTimePrivate::ValidDateTime,
                   status.testFlags(QDateTimePrivate::ValidDate | QDateTimePrivate::ValidTime));

    if (status.testFlag(QDateTimePrivate::ShortData))
        d.data.status = status.toInt();
    else
        d->m_status = status;
}